

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O3

ostream * operator<<(ostream *out,LinearSystem *system)

{
  string local_30;
  
  if (Options::output_type == 1) {
    LinearSystem::ToLaTex_abi_cxx11_(&local_30,system);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_30._M_dataplus._M_p,local_30._M_string_length);
  }
  else {
    if (Options::output_type != 0) {
      return out;
    }
    LinearSystem::ToString_abi_cxx11_(&local_30,system);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_30._M_dataplus._M_p,local_30._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const LinearSystem& system) {
  if (Options::output_type == Options::OutputType::Standard) {
    out << system.ToString();
  } else if (Options::output_type == Options::OutputType::LaTex) {
    out << system.ToLaTex();
  }

  return out;
}